

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_io.c
# Opt level: O0

int lj_cf_io_lines(lua_State *L)

{
  TValue *pTVar1;
  int iVar2;
  IOFileUD *pIVar3;
  IOFileUD *iof;
  lua_State *L_local;
  
  if (L->base == L->top) {
    pTVar1 = L->top;
    L->top = pTVar1 + 1;
    pTVar1->u64 = 0xffffffffffffffff;
  }
  if (L->base->u64 == 0xffffffffffffffff) {
    L->base->u64 = *(ulong *)((L->glref).ptr64 + 0x2c8) | 0xfff9800000000000;
  }
  else {
    pIVar3 = io_file_open(L,"r");
    pIVar3->type = 4;
    L->top = L->top + -1;
    L->base->u64 = L->top->u64 & 0x7fffffffffff | 0xfff9800000000000;
  }
  iVar2 = io_file_lines(L);
  return iVar2;
}

Assistant:

LJLIB_CF(io_lines)
{
  if (L->base == L->top) setnilV(L->top++);
  if (!tvisnil(L->base)) {  /* io.lines(fname) */
    IOFileUD *iof = io_file_open(L, "r");
    iof->type = IOFILE_TYPE_FILE|IOFILE_FLAG_CLOSE;
    L->top--;
    setudataV(L, L->base, udataV(L->top));
  } else {  /* io.lines() iterates over stdin. */
    setudataV(L, L->base, IOSTDF_UD(L, GCROOT_IO_INPUT));
  }
  return io_file_lines(L);
}